

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

float * stbi_loadf_from_file(FILE *f,int *x,int *y,int *comp,int req_comp)

{
  int *data;
  int iVar1;
  float *pfVar2;
  undefined1 local_100 [8];
  stbi__context s;
  
  data = &s.read_from_callbacks;
  s.io.skip = stbi__stdio_eof;
  s.img_n = 0x117eba;
  s.img_out_n = 0;
  s.io.read._0_4_ = 0x117ed5;
  s.io.read._4_4_ = 0;
  s.io_user_data = (void *)0x8000000001;
  s.io.eof = (_func_int_void_ptr *)f;
  s.img_buffer_end = (stbi_uc *)data;
  iVar1 = stbi__stdio_read(f,(char *)data,0x80);
  if (iVar1 == 0) {
    s.img_buffer = (stbi_uc *)((long)&s.read_from_callbacks + 1);
    s.io_user_data = (void *)((ulong)s.io_user_data & 0xffffffff00000000);
    s.read_from_callbacks._0_1_ = 0;
  }
  else {
    s.img_buffer = (stbi_uc *)((long)iVar1 + (long)data);
  }
  s.buffer_start._120_8_ = data;
  pfVar2 = stbi__loadf_main((stbi__context *)local_100,x,y,comp,req_comp);
  return pfVar2;
}

Assistant:

STBIDEF float *stbi_loadf_from_file(FILE *f, int *x, int *y, int *comp, int req_comp)
{
   stbi__context s;
   stbi__start_file(&s,f);
   return stbi__loadf_main(&s,x,y,comp,req_comp);
}